

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_Subscription_deleteMembers(UA_Subscription *subscription,UA_Server *server)

{
  UA_MonitoredItem *monitoredItem;
  UA_MonitoredItem **ppUVar1;
  UA_NotificationMessageEntry *pUVar2;
  UA_NotificationMessageEntry **ppUVar3;
  anon_struct_16_2_4dd83919_for_listEntry *paVar4;
  UA_MonitoredItem *pUVar5;
  UA_NotificationMessageEntry *__ptr;
  
  if (subscription->publishJobIsRegistered == true) {
    subscription->publishJobIsRegistered = false;
    UA_Server_removeRepeatedJob(server,subscription->publishJobGuid);
  }
  monitoredItem = (subscription->monitoredItems).lh_first;
  if (monitoredItem != (UA_MonitoredItem *)0x0) {
    for (pUVar5 = (monitoredItem->listEntry).le_next; pUVar5 != (UA_MonitoredItem *)0x0;
        pUVar5 = (pUVar5->listEntry).le_next) {
      ppUVar1 = (monitoredItem->listEntry).le_prev;
      (pUVar5->listEntry).le_prev = ppUVar1;
      *ppUVar1 = pUVar5;
      MonitoredItem_delete(server,monitoredItem);
      monitoredItem = pUVar5;
    }
    *(monitoredItem->listEntry).le_prev = (UA_MonitoredItem *)0x0;
    MonitoredItem_delete(server,monitoredItem);
  }
  __ptr = (subscription->retransmissionQueue).tqh_first;
  if (__ptr != (UA_NotificationMessageEntry *)0x0) {
    do {
      pUVar2 = (__ptr->listEntry).tqe_next;
      paVar4 = &pUVar2->listEntry;
      if (pUVar2 == (UA_NotificationMessageEntry *)0x0) {
        paVar4 = (anon_struct_16_2_4dd83919_for_listEntry *)&subscription->retransmissionQueue;
      }
      ppUVar3 = (__ptr->listEntry).tqe_prev;
      paVar4->tqe_prev = ppUVar3;
      *ppUVar3 = pUVar2;
      deleteMembers_noInit(&__ptr->message,UA_TYPES + 0x22);
      free(__ptr);
      __ptr = pUVar2;
    } while (pUVar2 != (UA_NotificationMessageEntry *)0x0);
  }
  subscription->retransmissionQueueSize = 0;
  return;
}

Assistant:

void UA_Subscription_deleteMembers(UA_Subscription *subscription, UA_Server *server) {
    Subscription_unregisterPublishJob(server, subscription);

    /* Delete monitored Items */
    UA_MonitoredItem *mon, *tmp_mon;
    LIST_FOREACH_SAFE(mon, &subscription->monitoredItems, listEntry, tmp_mon) {
        LIST_REMOVE(mon, listEntry);
        MonitoredItem_delete(server, mon);
    }

    /* Delete Retransmission Queue */
    UA_NotificationMessageEntry *nme, *nme_tmp;
    TAILQ_FOREACH_SAFE(nme, &subscription->retransmissionQueue, listEntry, nme_tmp) {
        TAILQ_REMOVE(&subscription->retransmissionQueue, nme, listEntry);
        UA_NotificationMessage_deleteMembers(&nme->message);
        UA_free(nme);
    }
    subscription->retransmissionQueueSize = 0;
}